

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O0

SUNErrCode
SUNHashMap_New(int64_t capacity,_func_SUNErrCode_SUNHashMapKeyValue_ptr *destroyKeyValue,
              SUNHashMap *map)

{
  SUNErrCode SVar1;
  void *pvVar2;
  SUNStlVector_SUNHashMapKeyValue self;
  long *in_RDX;
  long in_RDI;
  SUNErrCode err;
  int64_t i;
  SUNStlVector_SUNHashMapKeyValue buckets;
  _func_SUNErrCode_SUNHashMapKeyValue_ptr *in_stack_ffffffffffffffd0;
  SUNHashMapKeyValue element;
  int64_t in_stack_ffffffffffffffd8;
  SUNErrCode local_4;
  
  if (in_RDI < 1) {
    local_4 = -0x270d;
  }
  else {
    *in_RDX = 0;
    pvVar2 = malloc(0x10);
    *in_RDX = (long)pvVar2;
    if (in_RDX == (long *)0x0) {
      local_4 = -0x2704;
    }
    else {
      self = SUNStlVector_SUNHashMapKeyValue_New
                       (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      if (self == (SUNStlVector_SUNHashMapKeyValue)0x0) {
        free((void *)*in_RDX);
        local_4 = -0x2704;
      }
      else {
        for (element = (SUNHashMapKeyValue)0x0; (long)element < in_RDI;
            element = (SUNHashMapKeyValue)((long)&element->key + 1)) {
          SVar1 = SUNStlVector_SUNHashMapKeyValue_PushBack(self,element);
          if (SVar1 != 0) {
            return SVar1;
          }
        }
        *(SUNStlVector_SUNHashMapKeyValue *)(*in_RDX + 8) = self;
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

SUNErrCode SUNHashMap_New(int64_t capacity,
                          SUNErrCode (*destroyKeyValue)(SUNHashMapKeyValue* kv_ptr),
                          SUNHashMap* map)
{
  if (capacity <= 0) { return SUN_ERR_ARG_OUTOFRANGE; }

  *map = NULL;
  *map = (SUNHashMap)malloc(sizeof(**map));

  if (!map) { return SUN_ERR_MALLOC_FAIL; }

  SUNStlVector_SUNHashMapKeyValue buckets =
    SUNStlVector_SUNHashMapKeyValue_New(capacity, destroyKeyValue);
  if (!buckets)
  {
    free(*map);
    return SUN_ERR_MALLOC_FAIL;
  }

  /* Initialize all buckets to NULL */
  for (int64_t i = 0; i < capacity; i++)
  {
    SUNErrCode err = SUNStlVector_SUNHashMapKeyValue_PushBack(buckets, NULL);
    if (err) { return err; };
  }

  (*map)->buckets = buckets;

  return SUN_SUCCESS;
}